

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

int opengv::absolute_pose::modules::gpnp3::init(EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_R8;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  Vector3d temp;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_60;
  double local_48;
  double dStack_40;
  double local_38;
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_48,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_60);
  dVar13 = local_48 * local_48;
  dVar18 = dStack_40 * dStack_40;
  dVar7 = local_38 * local_38;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&local_48,&local_60);
  dVar14 = local_48 * local_48;
  dVar19 = dStack_40 * dStack_40;
  dVar8 = local_38 * local_38;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&local_48,&local_60);
  dVar15 = local_48 * local_48;
  dVar20 = dStack_40 * dStack_40;
  dVar9 = local_38 * local_38;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&local_48,&local_60);
  dVar1 = in_R8[1];
  dVar2 = *in_R8;
  dVar3 = in_R8[4];
  dVar4 = in_R8[3];
  auVar318._8_8_ = 0;
  auVar318._0_8_ = dVar4;
  dVar5 = in_R8[5];
  auVar495._8_8_ = 0;
  auVar495._0_8_ = dVar5;
  auVar16 = ZEXT816(0xc000000000000000);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
  auVar17 = vsqrtsd_avx(auVar21,auVar21);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = dVar2 * -2.0;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = dVar1 * -2.0 * dVar3;
  auVar12 = vfmadd231sd_fma(auVar477,auVar318,auVar231);
  dVar6 = in_R8[2];
  auVar543._8_8_ = 0;
  auVar543._0_8_ = dVar6 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar543,auVar495,auVar12);
  *(double *)(ctx + 0x3c0) =
       dVar5 * dVar5 +
       dVar6 * dVar6 + dVar3 * dVar3 + dVar1 * dVar1 + dVar4 * dVar4 + auVar12._0_8_ + dVar2 * dVar2
  ;
  dVar1 = *in_RCX;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = in_R8[3];
  auVar409._8_8_ = 0;
  auVar409._0_8_ = *in_R8;
  dVar2 = in_RCX[1];
  auVar478._8_8_ = 0;
  auVar478._0_8_ = in_R8[1];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1 * -2.0 * in_R8[3];
  auVar232._8_8_ = 0;
  auVar232._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd231sd_fma(auVar23,auVar409,auVar232);
  dVar1 = in_RCX[3];
  auVar233._8_8_ = 0;
  auVar233._0_8_ = dVar1;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = *in_R8 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar410,auVar233,auVar12);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar24,auVar319,auVar12);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar234,auVar478,auVar12);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = in_R8[4];
  auVar165._8_8_ = 0;
  auVar165._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar165,auVar25,auVar12);
  dVar1 = in_RCX[4];
  auVar235._8_8_ = 0;
  auVar235._0_8_ = dVar1;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = in_R8[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar320,auVar235,auVar12);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar166,auVar25,auVar12);
  dVar1 = in_RCX[2];
  auVar321._8_8_ = 0;
  auVar321._0_8_ = in_R8[2];
  auVar236._8_8_ = 0;
  auVar236._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar236,auVar321,auVar12);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = in_R8[5];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar26,auVar167,auVar12);
  dVar1 = in_RCX[5];
  auVar237._8_8_ = 0;
  auVar237._0_8_ = dVar1;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = in_R8[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar322,auVar237,auVar12);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar27,auVar167,auVar12);
  *(long *)(ctx + 0x438) = auVar12._0_8_;
  dVar1 = in_RCX[1];
  dVar2 = *in_RCX;
  dVar3 = in_RCX[4];
  dVar4 = in_RCX[3];
  auVar323._8_8_ = 0;
  auVar323._0_8_ = dVar4;
  dVar5 = in_RCX[5];
  auVar496._8_8_ = 0;
  auVar496._0_8_ = dVar5;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = dVar2 * -2.0;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = dVar1 * -2.0 * dVar3;
  auVar12 = vfmadd231sd_fma(auVar479,auVar323,auVar238);
  dVar6 = in_RCX[2];
  auVar544._8_8_ = 0;
  auVar544._0_8_ = dVar6 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar544,auVar496,auVar12);
  *(double *)(ctx + 0x4b0) =
       dVar5 * dVar5 +
       dVar6 * dVar6 + dVar3 * dVar3 + dVar1 * dVar1 + dVar4 * dVar4 + auVar12._0_8_ + dVar2 * dVar2
  ;
  dVar1 = *in_RDX;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = in_R8[3];
  auVar411._8_8_ = 0;
  auVar411._0_8_ = *in_R8;
  dVar2 = in_RDX[1];
  auVar480._8_8_ = 0;
  auVar480._0_8_ = in_R8[1];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1 * -2.0 * in_R8[3];
  auVar239._8_8_ = 0;
  auVar239._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd231sd_fma(auVar28,auVar411,auVar239);
  dVar1 = in_RDX[3];
  auVar240._8_8_ = 0;
  auVar240._0_8_ = dVar1;
  auVar412._8_8_ = 0;
  auVar412._0_8_ = *in_R8 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar412,auVar240,auVar12);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar29,auVar324,auVar12);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar241,auVar480,auVar12);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = in_R8[4];
  auVar168._8_8_ = 0;
  auVar168._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar168,auVar30,auVar12);
  dVar1 = in_RDX[4];
  auVar242._8_8_ = 0;
  auVar242._0_8_ = dVar1;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = in_R8[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar325,auVar242,auVar12);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar169,auVar30,auVar12);
  dVar1 = in_RDX[2];
  auVar326._8_8_ = 0;
  auVar326._0_8_ = in_R8[2];
  auVar243._8_8_ = 0;
  auVar243._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar243,auVar326,auVar12);
  auVar170._8_8_ = 0;
  auVar170._0_8_ = in_R8[5];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar31,auVar170,auVar12);
  dVar1 = in_RDX[5];
  auVar244._8_8_ = 0;
  auVar244._0_8_ = dVar1;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = in_R8[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar327,auVar244,auVar12);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar32,auVar170,auVar12);
  *(long *)(ctx + 0x528) = auVar12._0_8_;
  dVar1 = *in_RDX;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = in_RCX[3];
  auVar413._8_8_ = 0;
  auVar413._0_8_ = *in_RCX;
  dVar2 = in_RDX[1];
  auVar481._8_8_ = 0;
  auVar481._0_8_ = in_RCX[1];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1 * -2.0 * in_RCX[3];
  auVar245._8_8_ = 0;
  auVar245._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd231sd_fma(auVar33,auVar413,auVar245);
  dVar1 = in_RDX[3];
  auVar246._8_8_ = 0;
  auVar246._0_8_ = dVar1;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = *in_RCX * -2.0;
  auVar12 = vfmadd213sd_fma(auVar414,auVar246,auVar12);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar34,auVar328,auVar12);
  auVar247._8_8_ = 0;
  auVar247._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar247,auVar481,auVar12);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = in_RCX[4];
  auVar171._8_8_ = 0;
  auVar171._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar171,auVar35,auVar12);
  dVar1 = in_RDX[4];
  auVar248._8_8_ = 0;
  auVar248._0_8_ = dVar1;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = in_RCX[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar329,auVar248,auVar12);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar172,auVar35,auVar12);
  dVar1 = in_RDX[2];
  auVar330._8_8_ = 0;
  auVar330._0_8_ = in_RCX[2];
  auVar249._8_8_ = 0;
  auVar249._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar249,auVar330,auVar12);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = in_RCX[5];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar36,auVar173,auVar12);
  dVar1 = in_RDX[5];
  auVar250._8_8_ = 0;
  auVar250._0_8_ = dVar1;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = in_RCX[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar331,auVar250,auVar12);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar37,auVar173,auVar12);
  *(long *)(ctx + 0x5a0) = auVar12._0_8_;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  dVar3 = in_RDX[4];
  dVar4 = in_RDX[3];
  auVar332._8_8_ = 0;
  auVar332._0_8_ = dVar4;
  dVar5 = in_RDX[5];
  auVar497._8_8_ = 0;
  auVar497._0_8_ = dVar5;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = dVar2 * -2.0;
  auVar482._8_8_ = 0;
  auVar482._0_8_ = dVar1 * -2.0 * dVar3;
  auVar12 = vfmadd231sd_fma(auVar482,auVar332,auVar251);
  dVar6 = in_RDX[2];
  auVar545._8_8_ = 0;
  auVar545._0_8_ = dVar6 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar545,auVar497,auVar12);
  *(double *)(ctx + 0x618) =
       dVar5 * dVar5 +
       dVar6 * dVar6 + dVar3 * dVar3 + dVar1 * dVar1 + dVar4 * dVar4 + auVar12._0_8_ + dVar2 * dVar2
  ;
  dVar1 = *in_RSI;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = in_R8[3];
  auVar415._8_8_ = 0;
  auVar415._0_8_ = *in_R8;
  dVar2 = in_RSI[1];
  auVar483._8_8_ = 0;
  auVar483._0_8_ = in_R8[1];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar1 * -2.0 * in_R8[3];
  auVar252._8_8_ = 0;
  auVar252._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd231sd_fma(auVar38,auVar415,auVar252);
  dVar1 = in_RSI[3];
  auVar253._8_8_ = 0;
  auVar253._0_8_ = dVar1;
  auVar416._8_8_ = 0;
  auVar416._0_8_ = *in_R8 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar416,auVar253,auVar12);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar39,auVar333,auVar12);
  auVar254._8_8_ = 0;
  auVar254._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar254,auVar483,auVar12);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = in_R8[4];
  auVar174._8_8_ = 0;
  auVar174._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar174,auVar40,auVar12);
  dVar1 = in_RSI[4];
  auVar255._8_8_ = 0;
  auVar255._0_8_ = dVar1;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = in_R8[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar334,auVar255,auVar12);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar175,auVar40,auVar12);
  dVar1 = in_RSI[2];
  auVar335._8_8_ = 0;
  auVar335._0_8_ = in_R8[2];
  auVar256._8_8_ = 0;
  auVar256._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar256,auVar335,auVar12);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = in_R8[5];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar41,auVar176,auVar12);
  dVar1 = in_RSI[5];
  auVar257._8_8_ = 0;
  auVar257._0_8_ = dVar1;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = in_R8[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar336,auVar257,auVar12);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar42,auVar176,auVar12);
  *(long *)(ctx + 0x690) = auVar12._0_8_;
  dVar1 = *in_RSI;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = in_RCX[3];
  auVar417._8_8_ = 0;
  auVar417._0_8_ = *in_RCX;
  dVar2 = in_RSI[1];
  auVar484._8_8_ = 0;
  auVar484._0_8_ = in_RCX[1];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar1 * -2.0 * in_RCX[3];
  auVar258._8_8_ = 0;
  auVar258._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd231sd_fma(auVar43,auVar417,auVar258);
  dVar1 = in_RSI[3];
  auVar259._8_8_ = 0;
  auVar259._0_8_ = dVar1;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = *in_RCX * -2.0;
  auVar12 = vfmadd213sd_fma(auVar418,auVar259,auVar12);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar44,auVar337,auVar12);
  auVar260._8_8_ = 0;
  auVar260._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar260,auVar484,auVar12);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = in_RCX[4];
  auVar177._8_8_ = 0;
  auVar177._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar177,auVar45,auVar12);
  dVar1 = in_RSI[4];
  auVar261._8_8_ = 0;
  auVar261._0_8_ = dVar1;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = in_RCX[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar338,auVar261,auVar12);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar178,auVar45,auVar12);
  dVar1 = in_RSI[2];
  auVar339._8_8_ = 0;
  auVar339._0_8_ = in_RCX[2];
  auVar262._8_8_ = 0;
  auVar262._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar262,auVar339,auVar12);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = in_RCX[5];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar46,auVar179,auVar12);
  dVar1 = in_RSI[5];
  auVar263._8_8_ = 0;
  auVar263._0_8_ = dVar1;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = in_RCX[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar340,auVar263,auVar12);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar47,auVar179,auVar12);
  *(long *)(ctx + 0x708) = auVar12._0_8_;
  dVar1 = *in_RSI;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = in_RDX[3];
  auVar419._8_8_ = 0;
  auVar419._0_8_ = *in_RDX;
  dVar2 = in_RSI[1];
  auVar485._8_8_ = 0;
  auVar485._0_8_ = in_RDX[1];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar1 * -2.0 * in_RDX[3];
  auVar264._8_8_ = 0;
  auVar264._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd231sd_fma(auVar48,auVar419,auVar264);
  dVar1 = in_RSI[3];
  auVar265._8_8_ = 0;
  auVar265._0_8_ = dVar1;
  auVar420._8_8_ = 0;
  auVar420._0_8_ = *in_RDX * -2.0;
  auVar12 = vfmadd213sd_fma(auVar420,auVar265,auVar12);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar49,auVar341,auVar12);
  auVar266._8_8_ = 0;
  auVar266._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar266,auVar485,auVar12);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = in_RDX[4];
  auVar180._8_8_ = 0;
  auVar180._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar180,auVar50,auVar12);
  dVar1 = in_RSI[4];
  auVar267._8_8_ = 0;
  auVar267._0_8_ = dVar1;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = in_RDX[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar342,auVar267,auVar12);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar181,auVar50,auVar12);
  dVar1 = in_RSI[2];
  auVar343._8_8_ = 0;
  auVar343._0_8_ = in_RDX[2];
  auVar268._8_8_ = 0;
  auVar268._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar268,auVar343,auVar12);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = in_RDX[5];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar51,auVar182,auVar12);
  dVar1 = in_RSI[5];
  auVar269._8_8_ = 0;
  auVar269._0_8_ = dVar1;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = in_RDX[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar344,auVar269,auVar12);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar1 + dVar1;
  auVar10 = vfmadd213sd_fma(auVar52,auVar182,auVar12);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar7 + dVar13 + dVar18;
  auVar12 = vsqrtsd_avx(auVar16,auVar12);
  *(long *)(ctx + 0x780) = auVar10._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  dVar3 = in_RSI[3];
  auVar345._8_8_ = 0;
  auVar345._0_8_ = dVar3;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar1 * -2.0;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = dVar1 * dVar1 - auVar12._0_8_ * auVar12._0_8_;
  auVar12 = vfmadd213sd_fma(auVar53,auVar345,auVar270);
  dVar1 = in_RSI[4];
  auVar271._8_8_ = 0;
  auVar271._0_8_ = dVar1;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar2 * dVar2 + dVar3 * dVar3 + auVar12._0_8_;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar183,auVar271,auVar54);
  dVar2 = in_RSI[2];
  dVar3 = in_RSI[5];
  auVar272._8_8_ = 0;
  auVar272._0_8_ = dVar3;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar2 * dVar2 + dVar1 * dVar1 + auVar12._0_8_;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar184,auVar272,auVar55);
  *(double *)(ctx + 0x7f8) = dVar3 * dVar3 + auVar12._0_8_;
  dVar1 = in_R8[1];
  dVar2 = *in_R8;
  dVar3 = in_R8[7];
  dVar4 = in_R8[6];
  auVar346._8_8_ = 0;
  auVar346._0_8_ = dVar4;
  dVar5 = in_R8[8];
  auVar498._8_8_ = 0;
  auVar498._0_8_ = dVar5;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = dVar2 * -2.0;
  auVar486._8_8_ = 0;
  auVar486._0_8_ = dVar1 * -2.0 * dVar3;
  auVar12 = vfmadd231sd_fma(auVar486,auVar346,auVar273);
  dVar6 = in_R8[2];
  auVar546._8_8_ = 0;
  auVar546._0_8_ = dVar6 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar546,auVar498,auVar12);
  *(double *)(ctx + 0x3c8) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar12._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RCX[1];
  dVar2 = *in_RCX;
  auVar421._8_8_ = 0;
  auVar421._0_8_ = *in_R8;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = in_R8[2];
  auVar274._8_8_ = 0;
  auVar274._0_8_ = dVar2 + dVar2;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = (dVar1 + dVar1) * in_R8[1];
  auVar12 = vfmadd231sd_fma(auVar347,auVar421,auVar274);
  dVar3 = in_RCX[2];
  auVar499._8_8_ = 0;
  auVar499._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar499,auVar547,auVar12);
  auVar348._8_8_ = 0;
  auVar348._0_8_ = in_R8[6];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar56,auVar348,auVar12);
  dVar2 = in_RCX[6];
  auVar500._8_8_ = 0;
  auVar500._0_8_ = dVar2;
  auVar422._8_8_ = 0;
  auVar422._0_8_ = *in_R8 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar422,auVar500,auVar12);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar57,auVar348,auVar12);
  auVar349._8_8_ = 0;
  auVar349._0_8_ = in_R8[7];
  auVar185._8_8_ = 0;
  auVar185._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar185,auVar349,auVar12);
  dVar1 = in_RCX[7];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar1;
  auVar423._8_8_ = 0;
  auVar423._0_8_ = in_R8[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar423,auVar58,auVar12);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = in_R8[8];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar59,auVar349,auVar12);
  auVar275._8_8_ = 0;
  auVar275._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar275,auVar186,auVar12);
  dVar1 = in_RCX[8];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar1;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = in_R8[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar350,auVar60,auVar12);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar61,auVar186,auVar12);
  *(long *)(ctx + 0x440) = auVar12._0_8_;
  dVar1 = in_RCX[1];
  dVar2 = *in_RCX;
  dVar3 = in_RCX[7];
  dVar4 = in_RCX[6];
  auVar351._8_8_ = 0;
  auVar351._0_8_ = dVar4;
  dVar5 = in_RCX[8];
  auVar501._8_8_ = 0;
  auVar501._0_8_ = dVar5;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = dVar2 * -2.0;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = dVar1 * -2.0 * dVar3;
  auVar12 = vfmadd231sd_fma(auVar487,auVar351,auVar276);
  dVar6 = in_RCX[2];
  auVar548._8_8_ = 0;
  auVar548._0_8_ = dVar6 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar548,auVar501,auVar12);
  *(double *)(ctx + 0x4b8) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar12._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = *in_R8;
  auVar549._8_8_ = 0;
  auVar549._0_8_ = in_R8[2];
  auVar277._8_8_ = 0;
  auVar277._0_8_ = dVar2 + dVar2;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = (dVar1 + dVar1) * in_R8[1];
  auVar12 = vfmadd231sd_fma(auVar352,auVar424,auVar277);
  dVar3 = in_RDX[2];
  auVar502._8_8_ = 0;
  auVar502._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar502,auVar549,auVar12);
  auVar353._8_8_ = 0;
  auVar353._0_8_ = in_R8[6];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar62,auVar353,auVar12);
  dVar2 = in_RDX[6];
  auVar503._8_8_ = 0;
  auVar503._0_8_ = dVar2;
  auVar425._8_8_ = 0;
  auVar425._0_8_ = *in_R8 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar425,auVar503,auVar12);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar63,auVar353,auVar12);
  auVar354._8_8_ = 0;
  auVar354._0_8_ = in_R8[7];
  auVar187._8_8_ = 0;
  auVar187._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar187,auVar354,auVar12);
  dVar1 = in_RDX[7];
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar1;
  auVar426._8_8_ = 0;
  auVar426._0_8_ = in_R8[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar426,auVar64,auVar12);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = in_R8[8];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar65,auVar354,auVar12);
  auVar278._8_8_ = 0;
  auVar278._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar278,auVar188,auVar12);
  dVar1 = in_RDX[8];
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar1;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = in_R8[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar355,auVar66,auVar12);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar67,auVar188,auVar12);
  *(long *)(ctx + 0x530) = auVar12._0_8_;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  auVar427._8_8_ = 0;
  auVar427._0_8_ = *in_RCX;
  auVar550._8_8_ = 0;
  auVar550._0_8_ = in_RCX[2];
  auVar279._8_8_ = 0;
  auVar279._0_8_ = dVar2 + dVar2;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = (dVar1 + dVar1) * in_RCX[1];
  auVar12 = vfmadd231sd_fma(auVar356,auVar427,auVar279);
  dVar3 = in_RDX[2];
  auVar504._8_8_ = 0;
  auVar504._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar504,auVar550,auVar12);
  auVar357._8_8_ = 0;
  auVar357._0_8_ = in_RCX[6];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar68,auVar357,auVar12);
  dVar2 = in_RDX[6];
  auVar505._8_8_ = 0;
  auVar505._0_8_ = dVar2;
  auVar428._8_8_ = 0;
  auVar428._0_8_ = *in_RCX * -2.0;
  auVar12 = vfmadd213sd_fma(auVar428,auVar505,auVar12);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar69,auVar357,auVar12);
  auVar358._8_8_ = 0;
  auVar358._0_8_ = in_RCX[7];
  auVar189._8_8_ = 0;
  auVar189._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar189,auVar358,auVar12);
  dVar1 = in_RDX[7];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar1;
  auVar429._8_8_ = 0;
  auVar429._0_8_ = in_RCX[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar429,auVar70,auVar12);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = in_RCX[8];
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar71,auVar358,auVar12);
  auVar280._8_8_ = 0;
  auVar280._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar280,auVar190,auVar12);
  dVar1 = in_RDX[8];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar1;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = in_RCX[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar359,auVar72,auVar12);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar73,auVar190,auVar12);
  *(long *)(ctx + 0x5a8) = auVar12._0_8_;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  dVar3 = in_RDX[7];
  dVar4 = in_RDX[6];
  auVar360._8_8_ = 0;
  auVar360._0_8_ = dVar4;
  dVar5 = in_RDX[8];
  auVar506._8_8_ = 0;
  auVar506._0_8_ = dVar5;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = dVar2 * -2.0;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = dVar1 * -2.0 * dVar3;
  auVar12 = vfmadd231sd_fma(auVar488,auVar360,auVar281);
  dVar6 = in_RDX[2];
  auVar551._8_8_ = 0;
  auVar551._0_8_ = dVar6 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar551,auVar506,auVar12);
  *(double *)(ctx + 0x620) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar12._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar430._8_8_ = 0;
  auVar430._0_8_ = *in_R8;
  auVar552._8_8_ = 0;
  auVar552._0_8_ = in_R8[2];
  auVar282._8_8_ = 0;
  auVar282._0_8_ = dVar2 + dVar2;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = (dVar1 + dVar1) * in_R8[1];
  auVar12 = vfmadd231sd_fma(auVar361,auVar430,auVar282);
  dVar3 = in_RSI[2];
  auVar507._8_8_ = 0;
  auVar507._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar507,auVar552,auVar12);
  auVar362._8_8_ = 0;
  auVar362._0_8_ = in_R8[6];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar74,auVar362,auVar12);
  dVar2 = in_RSI[6];
  auVar508._8_8_ = 0;
  auVar508._0_8_ = dVar2;
  auVar431._8_8_ = 0;
  auVar431._0_8_ = *in_R8 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar431,auVar508,auVar12);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar75,auVar362,auVar12);
  auVar363._8_8_ = 0;
  auVar363._0_8_ = in_R8[7];
  auVar191._8_8_ = 0;
  auVar191._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar191,auVar363,auVar12);
  dVar1 = in_RSI[7];
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar1;
  auVar432._8_8_ = 0;
  auVar432._0_8_ = in_R8[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar432,auVar76,auVar12);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = in_R8[8];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar77,auVar363,auVar12);
  auVar283._8_8_ = 0;
  auVar283._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar283,auVar192,auVar12);
  dVar1 = in_RSI[8];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar1;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = in_R8[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar364,auVar78,auVar12);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar79,auVar192,auVar12);
  *(long *)(ctx + 0x698) = auVar12._0_8_;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar433._8_8_ = 0;
  auVar433._0_8_ = *in_RCX;
  auVar553._8_8_ = 0;
  auVar553._0_8_ = in_RCX[2];
  auVar284._8_8_ = 0;
  auVar284._0_8_ = dVar2 + dVar2;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = (dVar1 + dVar1) * in_RCX[1];
  auVar12 = vfmadd231sd_fma(auVar365,auVar433,auVar284);
  dVar3 = in_RSI[2];
  auVar509._8_8_ = 0;
  auVar509._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar509,auVar553,auVar12);
  auVar366._8_8_ = 0;
  auVar366._0_8_ = in_RCX[6];
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar80,auVar366,auVar12);
  dVar2 = in_RSI[6];
  auVar510._8_8_ = 0;
  auVar510._0_8_ = dVar2;
  auVar434._8_8_ = 0;
  auVar434._0_8_ = *in_RCX * -2.0;
  auVar12 = vfmadd213sd_fma(auVar434,auVar510,auVar12);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar81,auVar366,auVar12);
  auVar367._8_8_ = 0;
  auVar367._0_8_ = in_RCX[7];
  auVar193._8_8_ = 0;
  auVar193._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar193,auVar367,auVar12);
  dVar1 = in_RSI[7];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar1;
  auVar435._8_8_ = 0;
  auVar435._0_8_ = in_RCX[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar435,auVar82,auVar12);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = in_RCX[8];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar83,auVar367,auVar12);
  auVar285._8_8_ = 0;
  auVar285._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar285,auVar194,auVar12);
  dVar1 = in_RSI[8];
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar1;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = in_RCX[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar368,auVar84,auVar12);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar85,auVar194,auVar12);
  *(long *)(ctx + 0x710) = auVar12._0_8_;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar436._8_8_ = 0;
  auVar436._0_8_ = *in_RDX;
  auVar554._8_8_ = 0;
  auVar554._0_8_ = in_RDX[2];
  auVar286._8_8_ = 0;
  auVar286._0_8_ = dVar2 + dVar2;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = (dVar1 + dVar1) * in_RDX[1];
  auVar12 = vfmadd231sd_fma(auVar369,auVar436,auVar286);
  dVar3 = in_RSI[2];
  auVar511._8_8_ = 0;
  auVar511._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar511,auVar554,auVar12);
  auVar370._8_8_ = 0;
  auVar370._0_8_ = in_RDX[6];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar86,auVar370,auVar12);
  dVar2 = in_RSI[6];
  auVar512._8_8_ = 0;
  auVar512._0_8_ = dVar2;
  auVar437._8_8_ = 0;
  auVar437._0_8_ = *in_RDX * -2.0;
  auVar12 = vfmadd213sd_fma(auVar437,auVar512,auVar12);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar87,auVar370,auVar12);
  auVar371._8_8_ = 0;
  auVar371._0_8_ = in_RDX[7];
  auVar195._8_8_ = 0;
  auVar195._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar195,auVar371,auVar12);
  dVar1 = in_RSI[7];
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar1;
  auVar438._8_8_ = 0;
  auVar438._0_8_ = in_RDX[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar438,auVar88,auVar12);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = in_RDX[8];
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar89,auVar371,auVar12);
  auVar287._8_8_ = 0;
  auVar287._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar287,auVar196,auVar12);
  dVar1 = in_RSI[8];
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar1;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = in_RDX[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar372,auVar90,auVar12);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar1 + dVar1;
  auVar11 = vfmadd213sd_fma(auVar91,auVar196,auVar12);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar8 + dVar14 + dVar19;
  auVar12 = vsqrtsd_avx(auVar16,auVar10);
  *(long *)(ctx + 0x788) = auVar11._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[6];
  auVar439._8_8_ = 0;
  auVar439._0_8_ = dVar4;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar1 * -2.0;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = (dVar1 * dVar1 - auVar12._0_8_ * auVar12._0_8_) + dVar2 * dVar2 + dVar3 * dVar3;
  auVar12 = vfmadd213sd_fma(auVar92,auVar439,auVar288);
  dVar1 = in_RSI[7];
  auVar289._8_8_ = 0;
  auVar289._0_8_ = dVar1;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar4 * dVar4 + auVar12._0_8_;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar197,auVar289,auVar93);
  dVar2 = in_RSI[8];
  auVar198._8_8_ = 0;
  auVar198._0_8_ = dVar2;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar1 * dVar1 + auVar12._0_8_;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar290,auVar198,auVar94);
  *(double *)(ctx + 0x800) = dVar2 * dVar2 + auVar12._0_8_;
  dVar1 = *in_R8;
  dVar2 = in_R8[1];
  dVar3 = in_R8[2];
  dVar4 = in_R8[9];
  auVar440._8_8_ = 0;
  auVar440._0_8_ = dVar4;
  dVar5 = in_R8[10];
  auVar489._8_8_ = 0;
  auVar489._0_8_ = dVar5;
  dVar6 = in_R8[0xb];
  auVar513._8_8_ = 0;
  auVar513._0_8_ = dVar6;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar1 * -2.0;
  auVar291._8_8_ = 0;
  auVar291._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4
  ;
  auVar12 = vfmadd213sd_fma(auVar95,auVar440,auVar291);
  auVar199._8_8_ = 0;
  auVar199._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar199,auVar489,auVar12);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar96,auVar513,auVar12);
  *(long *)(ctx + 0x3d0) = auVar12._0_8_;
  dVar1 = in_RCX[1];
  dVar2 = *in_RCX;
  auVar441._8_8_ = 0;
  auVar441._0_8_ = *in_R8;
  auVar555._8_8_ = 0;
  auVar555._0_8_ = in_R8[2];
  auVar292._8_8_ = 0;
  auVar292._0_8_ = dVar2 + dVar2;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = (dVar1 + dVar1) * in_R8[1];
  auVar12 = vfmadd231sd_fma(auVar373,auVar441,auVar292);
  dVar3 = in_RCX[2];
  auVar514._8_8_ = 0;
  auVar514._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar514,auVar555,auVar12);
  auVar374._8_8_ = 0;
  auVar374._0_8_ = in_R8[9];
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar97,auVar374,auVar12);
  dVar2 = in_RCX[9];
  auVar515._8_8_ = 0;
  auVar515._0_8_ = dVar2;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = *in_R8 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar442,auVar515,auVar12);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar98,auVar374,auVar12);
  auVar375._8_8_ = 0;
  auVar375._0_8_ = in_R8[10];
  auVar200._8_8_ = 0;
  auVar200._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar200,auVar375,auVar12);
  dVar1 = in_RCX[10];
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar1;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = in_R8[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar443,auVar99,auVar12);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = in_R8[0xb];
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar100,auVar375,auVar12);
  auVar293._8_8_ = 0;
  auVar293._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar293,auVar201,auVar12);
  dVar1 = in_RCX[0xb];
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar1;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = in_R8[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar376,auVar101,auVar12);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar102,auVar201,auVar12);
  *(long *)(ctx + 0x448) = auVar12._0_8_;
  dVar1 = *in_RCX;
  dVar2 = in_RCX[1];
  dVar3 = in_RCX[2];
  dVar4 = in_RCX[9];
  auVar444._8_8_ = 0;
  auVar444._0_8_ = dVar4;
  dVar5 = in_RCX[10];
  auVar490._8_8_ = 0;
  auVar490._0_8_ = dVar5;
  dVar6 = in_RCX[0xb];
  auVar516._8_8_ = 0;
  auVar516._0_8_ = dVar6;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = dVar1 * -2.0;
  auVar294._8_8_ = 0;
  auVar294._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4
  ;
  auVar12 = vfmadd213sd_fma(auVar103,auVar444,auVar294);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar202,auVar490,auVar12);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar104,auVar516,auVar12);
  *(long *)(ctx + 0x4c0) = auVar12._0_8_;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = *in_R8;
  auVar556._8_8_ = 0;
  auVar556._0_8_ = in_R8[2];
  auVar295._8_8_ = 0;
  auVar295._0_8_ = dVar2 + dVar2;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = (dVar1 + dVar1) * in_R8[1];
  auVar12 = vfmadd231sd_fma(auVar377,auVar445,auVar295);
  dVar3 = in_RDX[2];
  auVar517._8_8_ = 0;
  auVar517._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar517,auVar556,auVar12);
  auVar378._8_8_ = 0;
  auVar378._0_8_ = in_R8[9];
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar105,auVar378,auVar12);
  dVar2 = in_RDX[9];
  auVar518._8_8_ = 0;
  auVar518._0_8_ = dVar2;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = *in_R8 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar446,auVar518,auVar12);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar106,auVar378,auVar12);
  auVar379._8_8_ = 0;
  auVar379._0_8_ = in_R8[10];
  auVar203._8_8_ = 0;
  auVar203._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar203,auVar379,auVar12);
  dVar1 = in_RDX[10];
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar1;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = in_R8[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar447,auVar107,auVar12);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = in_R8[0xb];
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar108,auVar379,auVar12);
  auVar296._8_8_ = 0;
  auVar296._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar296,auVar204,auVar12);
  dVar1 = in_RDX[0xb];
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar1;
  auVar380._8_8_ = 0;
  auVar380._0_8_ = in_R8[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar380,auVar109,auVar12);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar110,auVar204,auVar12);
  *(long *)(ctx + 0x538) = auVar12._0_8_;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = *in_RCX;
  auVar557._8_8_ = 0;
  auVar557._0_8_ = in_RCX[2];
  auVar297._8_8_ = 0;
  auVar297._0_8_ = dVar2 + dVar2;
  auVar381._8_8_ = 0;
  auVar381._0_8_ = (dVar1 + dVar1) * in_RCX[1];
  auVar12 = vfmadd231sd_fma(auVar381,auVar448,auVar297);
  dVar3 = in_RDX[2];
  auVar519._8_8_ = 0;
  auVar519._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar519,auVar557,auVar12);
  auVar382._8_8_ = 0;
  auVar382._0_8_ = in_RCX[9];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar111,auVar382,auVar12);
  dVar2 = in_RDX[9];
  auVar520._8_8_ = 0;
  auVar520._0_8_ = dVar2;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = *in_RCX * -2.0;
  auVar12 = vfmadd213sd_fma(auVar449,auVar520,auVar12);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar112,auVar382,auVar12);
  auVar383._8_8_ = 0;
  auVar383._0_8_ = in_RCX[10];
  auVar205._8_8_ = 0;
  auVar205._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar205,auVar383,auVar12);
  dVar1 = in_RDX[10];
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar1;
  auVar450._8_8_ = 0;
  auVar450._0_8_ = in_RCX[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar450,auVar113,auVar12);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = in_RCX[0xb];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar114,auVar383,auVar12);
  auVar298._8_8_ = 0;
  auVar298._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar298,auVar206,auVar12);
  dVar1 = in_RDX[0xb];
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar1;
  auVar384._8_8_ = 0;
  auVar384._0_8_ = in_RCX[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar384,auVar115,auVar12);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar116,auVar206,auVar12);
  *(long *)(ctx + 0x5b0) = auVar12._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  dVar3 = in_RDX[2];
  dVar4 = in_RDX[9];
  auVar451._8_8_ = 0;
  auVar451._0_8_ = dVar4;
  dVar5 = in_RDX[10];
  auVar491._8_8_ = 0;
  auVar491._0_8_ = dVar5;
  dVar6 = in_RDX[0xb];
  auVar521._8_8_ = 0;
  auVar521._0_8_ = dVar6;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = dVar1 * -2.0;
  auVar299._8_8_ = 0;
  auVar299._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4
  ;
  auVar12 = vfmadd213sd_fma(auVar117,auVar451,auVar299);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar207,auVar491,auVar12);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar118,auVar521,auVar12);
  *(long *)(ctx + 0x628) = auVar12._0_8_;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = *in_R8;
  auVar558._8_8_ = 0;
  auVar558._0_8_ = in_R8[2];
  auVar300._8_8_ = 0;
  auVar300._0_8_ = dVar2 + dVar2;
  auVar385._8_8_ = 0;
  auVar385._0_8_ = (dVar1 + dVar1) * in_R8[1];
  auVar12 = vfmadd231sd_fma(auVar385,auVar452,auVar300);
  dVar3 = in_RSI[2];
  auVar522._8_8_ = 0;
  auVar522._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar522,auVar558,auVar12);
  auVar386._8_8_ = 0;
  auVar386._0_8_ = in_R8[9];
  auVar119._8_8_ = 0;
  auVar119._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar119,auVar386,auVar12);
  dVar2 = in_RSI[9];
  auVar523._8_8_ = 0;
  auVar523._0_8_ = dVar2;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = *in_R8 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar453,auVar523,auVar12);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar120,auVar386,auVar12);
  auVar387._8_8_ = 0;
  auVar387._0_8_ = in_R8[10];
  auVar208._8_8_ = 0;
  auVar208._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar208,auVar387,auVar12);
  dVar1 = in_RSI[10];
  auVar121._8_8_ = 0;
  auVar121._0_8_ = dVar1;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = in_R8[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar454,auVar121,auVar12);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = in_R8[0xb];
  auVar122._8_8_ = 0;
  auVar122._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar122,auVar387,auVar12);
  auVar301._8_8_ = 0;
  auVar301._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar301,auVar209,auVar12);
  dVar1 = in_RSI[0xb];
  auVar123._8_8_ = 0;
  auVar123._0_8_ = dVar1;
  auVar388._8_8_ = 0;
  auVar388._0_8_ = in_R8[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar388,auVar123,auVar12);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar124,auVar209,auVar12);
  *(long *)(ctx + 0x6a0) = auVar12._0_8_;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar455._8_8_ = 0;
  auVar455._0_8_ = *in_RCX;
  auVar559._8_8_ = 0;
  auVar559._0_8_ = in_RCX[2];
  auVar302._8_8_ = 0;
  auVar302._0_8_ = dVar2 + dVar2;
  auVar389._8_8_ = 0;
  auVar389._0_8_ = (dVar1 + dVar1) * in_RCX[1];
  auVar12 = vfmadd231sd_fma(auVar389,auVar455,auVar302);
  dVar3 = in_RSI[2];
  auVar524._8_8_ = 0;
  auVar524._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar524,auVar559,auVar12);
  auVar390._8_8_ = 0;
  auVar390._0_8_ = in_RCX[9];
  auVar125._8_8_ = 0;
  auVar125._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar125,auVar390,auVar12);
  dVar2 = in_RSI[9];
  auVar525._8_8_ = 0;
  auVar525._0_8_ = dVar2;
  auVar456._8_8_ = 0;
  auVar456._0_8_ = *in_RCX * -2.0;
  auVar12 = vfmadd213sd_fma(auVar456,auVar525,auVar12);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar126,auVar390,auVar12);
  auVar391._8_8_ = 0;
  auVar391._0_8_ = in_RCX[10];
  auVar210._8_8_ = 0;
  auVar210._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar210,auVar391,auVar12);
  dVar1 = in_RSI[10];
  auVar127._8_8_ = 0;
  auVar127._0_8_ = dVar1;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = in_RCX[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar457,auVar127,auVar12);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = in_RCX[0xb];
  auVar128._8_8_ = 0;
  auVar128._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar128,auVar391,auVar12);
  auVar303._8_8_ = 0;
  auVar303._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar303,auVar211,auVar12);
  dVar1 = in_RSI[0xb];
  auVar129._8_8_ = 0;
  auVar129._0_8_ = dVar1;
  auVar392._8_8_ = 0;
  auVar392._0_8_ = in_RCX[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar392,auVar129,auVar12);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar130,auVar211,auVar12);
  *(long *)(ctx + 0x718) = auVar12._0_8_;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = *in_RDX;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = in_RDX[2];
  auVar304._8_8_ = 0;
  auVar304._0_8_ = dVar2 + dVar2;
  auVar393._8_8_ = 0;
  auVar393._0_8_ = (dVar1 + dVar1) * in_RDX[1];
  auVar12 = vfmadd231sd_fma(auVar393,auVar458,auVar304);
  dVar3 = in_RSI[2];
  auVar526._8_8_ = 0;
  auVar526._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar526,auVar560,auVar12);
  auVar394._8_8_ = 0;
  auVar394._0_8_ = in_RDX[9];
  auVar131._8_8_ = 0;
  auVar131._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar131,auVar394,auVar12);
  dVar2 = in_RSI[9];
  auVar527._8_8_ = 0;
  auVar527._0_8_ = dVar2;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = *in_RDX * -2.0;
  auVar12 = vfmadd213sd_fma(auVar459,auVar527,auVar12);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = dVar2 + dVar2;
  auVar12 = vfmadd213sd_fma(auVar132,auVar394,auVar12);
  auVar395._8_8_ = 0;
  auVar395._0_8_ = in_RDX[10];
  auVar212._8_8_ = 0;
  auVar212._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar212,auVar395,auVar12);
  dVar1 = in_RSI[10];
  auVar133._8_8_ = 0;
  auVar133._0_8_ = dVar1;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = in_RDX[1] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar460,auVar133,auVar12);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = in_RDX[0xb];
  auVar134._8_8_ = 0;
  auVar134._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar134,auVar395,auVar12);
  auVar305._8_8_ = 0;
  auVar305._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar305,auVar213,auVar12);
  dVar1 = in_RSI[0xb];
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar1;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = in_RDX[2] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar396,auVar135,auVar12);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = dVar1 + dVar1;
  auVar10 = vfmadd213sd_fma(auVar136,auVar213,auVar12);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar9 + dVar15 + dVar20;
  auVar12 = vsqrtsd_avx(auVar16,auVar11);
  *(long *)(ctx + 0x790) = auVar10._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[9];
  auVar461._8_8_ = 0;
  auVar461._0_8_ = dVar4;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = dVar1 * -2.0;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = (dVar1 * dVar1 - auVar12._0_8_ * auVar12._0_8_) + dVar2 * dVar2 + dVar3 * dVar3;
  auVar12 = vfmadd213sd_fma(auVar137,auVar461,auVar306);
  dVar1 = in_RSI[10];
  auVar307._8_8_ = 0;
  auVar307._0_8_ = dVar1;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = dVar4 * dVar4 + auVar12._0_8_;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar214,auVar307,auVar138);
  dVar2 = in_RSI[0xb];
  auVar215._8_8_ = 0;
  auVar215._0_8_ = dVar2;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = dVar1 * dVar1 + auVar12._0_8_;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar308,auVar215,auVar139);
  *(double *)(ctx + 0x808) = dVar2 * dVar2 + auVar12._0_8_;
  dVar1 = in_R8[3];
  dVar2 = in_R8[4];
  dVar3 = in_R8[5];
  dVar4 = in_R8[6];
  auVar462._8_8_ = 0;
  auVar462._0_8_ = dVar4;
  dVar5 = in_R8[7];
  auVar492._8_8_ = 0;
  auVar492._0_8_ = dVar5;
  dVar6 = in_R8[8];
  auVar528._8_8_ = 0;
  auVar528._0_8_ = dVar6;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = dVar1 * -2.0;
  auVar309._8_8_ = 0;
  auVar309._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4
  ;
  auVar12 = vfmadd213sd_fma(auVar140,auVar462,auVar309);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar216,auVar492,auVar12);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar141,auVar528,auVar12);
  *(long *)(ctx + 0x3d8) = auVar12._0_8_;
  dVar1 = in_RCX[4];
  dVar2 = in_RCX[3];
  auVar463._8_8_ = 0;
  auVar463._0_8_ = in_R8[3];
  auVar561._8_8_ = 0;
  auVar561._0_8_ = in_R8[5];
  auVar581._8_8_ = 0;
  auVar581._0_8_ = in_R8[6];
  auVar594._8_8_ = 0;
  auVar594._0_8_ = in_R8[7];
  auVar606._8_8_ = 0;
  auVar606._0_8_ = in_R8[8];
  auVar310._8_8_ = 0;
  auVar310._0_8_ = dVar2 + dVar2;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = (dVar1 + dVar1) * in_R8[4];
  auVar12 = vfmadd231sd_fma(auVar397,auVar463,auVar310);
  dVar3 = in_RCX[5];
  auVar529._8_8_ = 0;
  auVar529._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar529,auVar561,auVar12);
  dVar4 = in_RCX[6];
  auVar398._8_8_ = 0;
  auVar398._0_8_ = dVar4;
  auVar568._8_8_ = 0;
  auVar568._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar568,auVar581,auVar12);
  dVar4 = in_RCX[7];
  auVar530._8_8_ = 0;
  auVar530._0_8_ = dVar4;
  auVar588._8_8_ = 0;
  auVar588._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar588,auVar594,auVar12);
  dVar4 = in_RCX[8];
  auVar569._8_8_ = 0;
  auVar569._0_8_ = dVar4;
  auVar600._8_8_ = 0;
  auVar600._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar600,auVar606,auVar12);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar142,auVar581,auVar12);
  auVar464._8_8_ = 0;
  auVar464._0_8_ = in_R8[3] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar464,auVar398,auVar12);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar143,auVar594,auVar12);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = in_R8[4] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar217,auVar530,auVar12);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar144,auVar606,auVar12);
  auVar218._8_8_ = 0;
  auVar218._0_8_ = in_R8[5] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar218,auVar569,auVar12);
  *(long *)(ctx + 0x450) = auVar12._0_8_;
  dVar1 = in_RCX[3];
  dVar2 = in_RCX[4];
  dVar3 = in_RCX[5];
  dVar4 = in_RCX[6];
  auVar465._8_8_ = 0;
  auVar465._0_8_ = dVar4;
  dVar5 = in_RCX[7];
  auVar493._8_8_ = 0;
  auVar493._0_8_ = dVar5;
  dVar6 = in_RCX[8];
  auVar531._8_8_ = 0;
  auVar531._0_8_ = dVar6;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = dVar1 * -2.0;
  auVar311._8_8_ = 0;
  auVar311._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4
  ;
  auVar12 = vfmadd213sd_fma(auVar145,auVar465,auVar311);
  auVar219._8_8_ = 0;
  auVar219._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar219,auVar493,auVar12);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar146,auVar531,auVar12);
  *(long *)(ctx + 0x4c8) = auVar12._0_8_;
  dVar1 = in_RDX[4];
  dVar2 = in_RDX[3];
  auVar466._8_8_ = 0;
  auVar466._0_8_ = in_R8[3];
  auVar562._8_8_ = 0;
  auVar562._0_8_ = in_R8[5];
  auVar582._8_8_ = 0;
  auVar582._0_8_ = in_R8[6];
  auVar595._8_8_ = 0;
  auVar595._0_8_ = in_R8[7];
  auVar607._8_8_ = 0;
  auVar607._0_8_ = in_R8[8];
  auVar312._8_8_ = 0;
  auVar312._0_8_ = dVar2 + dVar2;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = (dVar1 + dVar1) * in_R8[4];
  auVar12 = vfmadd231sd_fma(auVar399,auVar466,auVar312);
  dVar3 = in_RDX[5];
  auVar532._8_8_ = 0;
  auVar532._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar532,auVar562,auVar12);
  dVar4 = in_RDX[6];
  auVar400._8_8_ = 0;
  auVar400._0_8_ = dVar4;
  auVar570._8_8_ = 0;
  auVar570._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar570,auVar582,auVar12);
  dVar4 = in_RDX[7];
  auVar533._8_8_ = 0;
  auVar533._0_8_ = dVar4;
  auVar589._8_8_ = 0;
  auVar589._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar589,auVar595,auVar12);
  dVar4 = in_RDX[8];
  auVar571._8_8_ = 0;
  auVar571._0_8_ = dVar4;
  auVar601._8_8_ = 0;
  auVar601._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar601,auVar607,auVar12);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar147,auVar582,auVar12);
  auVar467._8_8_ = 0;
  auVar467._0_8_ = in_R8[3] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar467,auVar400,auVar12);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar148,auVar595,auVar12);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = in_R8[4] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar220,auVar533,auVar12);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar149,auVar607,auVar12);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = in_R8[5] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar221,auVar571,auVar12);
  *(long *)(ctx + 0x540) = auVar12._0_8_;
  dVar1 = in_RDX[4];
  dVar2 = in_RDX[3];
  auVar468._8_8_ = 0;
  auVar468._0_8_ = in_RCX[3];
  auVar563._8_8_ = 0;
  auVar563._0_8_ = in_RCX[5];
  auVar583._8_8_ = 0;
  auVar583._0_8_ = in_RCX[6];
  auVar596._8_8_ = 0;
  auVar596._0_8_ = in_RCX[7];
  auVar608._8_8_ = 0;
  auVar608._0_8_ = in_RCX[8];
  auVar313._8_8_ = 0;
  auVar313._0_8_ = dVar2 + dVar2;
  auVar401._8_8_ = 0;
  auVar401._0_8_ = (dVar1 + dVar1) * in_RCX[4];
  auVar12 = vfmadd231sd_fma(auVar401,auVar468,auVar313);
  dVar3 = in_RDX[5];
  auVar534._8_8_ = 0;
  auVar534._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar534,auVar563,auVar12);
  dVar4 = in_RDX[6];
  auVar402._8_8_ = 0;
  auVar402._0_8_ = dVar4;
  auVar572._8_8_ = 0;
  auVar572._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar572,auVar583,auVar12);
  dVar4 = in_RDX[7];
  auVar535._8_8_ = 0;
  auVar535._0_8_ = dVar4;
  auVar590._8_8_ = 0;
  auVar590._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar590,auVar596,auVar12);
  dVar4 = in_RDX[8];
  auVar573._8_8_ = 0;
  auVar573._0_8_ = dVar4;
  auVar602._8_8_ = 0;
  auVar602._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar602,auVar608,auVar12);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar150,auVar583,auVar12);
  auVar469._8_8_ = 0;
  auVar469._0_8_ = in_RCX[3] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar469,auVar402,auVar12);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar151,auVar596,auVar12);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = in_RCX[4] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar222,auVar535,auVar12);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar152,auVar608,auVar12);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = in_RCX[5] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar223,auVar573,auVar12);
  *(long *)(ctx + 0x5b8) = auVar12._0_8_;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  dVar3 = in_RDX[5];
  dVar4 = in_RDX[6];
  auVar470._8_8_ = 0;
  auVar470._0_8_ = dVar4;
  dVar5 = in_RDX[7];
  auVar494._8_8_ = 0;
  auVar494._0_8_ = dVar5;
  dVar6 = in_RDX[8];
  auVar536._8_8_ = 0;
  auVar536._0_8_ = dVar6;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = dVar1 * -2.0;
  auVar314._8_8_ = 0;
  auVar314._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4
  ;
  auVar12 = vfmadd213sd_fma(auVar153,auVar470,auVar314);
  auVar224._8_8_ = 0;
  auVar224._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar224,auVar494,auVar12);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar154,auVar536,auVar12);
  *(long *)(ctx + 0x630) = auVar12._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar471._8_8_ = 0;
  auVar471._0_8_ = in_R8[3];
  auVar564._8_8_ = 0;
  auVar564._0_8_ = in_R8[5];
  auVar584._8_8_ = 0;
  auVar584._0_8_ = in_R8[6];
  auVar597._8_8_ = 0;
  auVar597._0_8_ = in_R8[7];
  auVar609._8_8_ = 0;
  auVar609._0_8_ = in_R8[8];
  auVar315._8_8_ = 0;
  auVar315._0_8_ = dVar2 + dVar2;
  auVar403._8_8_ = 0;
  auVar403._0_8_ = (dVar1 + dVar1) * in_R8[4];
  auVar12 = vfmadd231sd_fma(auVar403,auVar471,auVar315);
  dVar3 = in_RSI[5];
  auVar537._8_8_ = 0;
  auVar537._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar537,auVar564,auVar12);
  dVar4 = in_RSI[6];
  auVar404._8_8_ = 0;
  auVar404._0_8_ = dVar4;
  auVar574._8_8_ = 0;
  auVar574._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar574,auVar584,auVar12);
  dVar4 = in_RSI[7];
  auVar538._8_8_ = 0;
  auVar538._0_8_ = dVar4;
  auVar591._8_8_ = 0;
  auVar591._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar591,auVar597,auVar12);
  dVar4 = in_RSI[8];
  auVar575._8_8_ = 0;
  auVar575._0_8_ = dVar4;
  auVar603._8_8_ = 0;
  auVar603._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar603,auVar609,auVar12);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar155,auVar584,auVar12);
  auVar472._8_8_ = 0;
  auVar472._0_8_ = in_R8[3] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar472,auVar404,auVar12);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar156,auVar597,auVar12);
  auVar225._8_8_ = 0;
  auVar225._0_8_ = in_R8[4] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar225,auVar538,auVar12);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar157,auVar609,auVar12);
  auVar226._8_8_ = 0;
  auVar226._0_8_ = in_R8[5] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar226,auVar575,auVar12);
  *(long *)(ctx + 0x6a8) = auVar12._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar473._8_8_ = 0;
  auVar473._0_8_ = in_RCX[3];
  auVar565._8_8_ = 0;
  auVar565._0_8_ = in_RCX[5];
  auVar585._8_8_ = 0;
  auVar585._0_8_ = in_RCX[6];
  auVar598._8_8_ = 0;
  auVar598._0_8_ = in_RCX[7];
  auVar610._8_8_ = 0;
  auVar610._0_8_ = in_RCX[8];
  auVar316._8_8_ = 0;
  auVar316._0_8_ = dVar2 + dVar2;
  auVar405._8_8_ = 0;
  auVar405._0_8_ = (dVar1 + dVar1) * in_RCX[4];
  auVar12 = vfmadd231sd_fma(auVar405,auVar473,auVar316);
  dVar3 = in_RSI[5];
  auVar539._8_8_ = 0;
  auVar539._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar539,auVar565,auVar12);
  dVar4 = in_RSI[6];
  auVar406._8_8_ = 0;
  auVar406._0_8_ = dVar4;
  auVar576._8_8_ = 0;
  auVar576._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar576,auVar585,auVar12);
  dVar4 = in_RSI[7];
  auVar540._8_8_ = 0;
  auVar540._0_8_ = dVar4;
  auVar592._8_8_ = 0;
  auVar592._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar592,auVar598,auVar12);
  dVar4 = in_RSI[8];
  auVar577._8_8_ = 0;
  auVar577._0_8_ = dVar4;
  auVar604._8_8_ = 0;
  auVar604._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar604,auVar610,auVar12);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar158,auVar585,auVar12);
  auVar474._8_8_ = 0;
  auVar474._0_8_ = in_RCX[3] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar474,auVar406,auVar12);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar159,auVar598,auVar12);
  auVar227._8_8_ = 0;
  auVar227._0_8_ = in_RCX[4] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar227,auVar540,auVar12);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar160,auVar610,auVar12);
  auVar228._8_8_ = 0;
  auVar228._0_8_ = in_RCX[5] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar228,auVar577,auVar12);
  *(long *)(ctx + 0x720) = auVar12._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar475._8_8_ = 0;
  auVar475._0_8_ = in_RDX[3];
  auVar566._8_8_ = 0;
  auVar566._0_8_ = in_RDX[5];
  auVar586._8_8_ = 0;
  auVar586._0_8_ = in_RDX[6];
  auVar599._8_8_ = 0;
  auVar599._0_8_ = in_RDX[7];
  auVar611._8_8_ = 0;
  auVar611._0_8_ = in_RDX[8];
  auVar317._8_8_ = 0;
  auVar317._0_8_ = dVar2 + dVar2;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = (dVar1 + dVar1) * in_RDX[4];
  auVar12 = vfmadd231sd_fma(auVar407,auVar475,auVar317);
  dVar3 = in_RSI[5];
  auVar541._8_8_ = 0;
  auVar541._0_8_ = dVar3 + dVar3;
  auVar12 = vfmadd213sd_fma(auVar541,auVar566,auVar12);
  dVar4 = in_RSI[6];
  auVar408._8_8_ = 0;
  auVar408._0_8_ = dVar4;
  auVar578._8_8_ = 0;
  auVar578._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar578,auVar586,auVar12);
  dVar4 = in_RSI[7];
  auVar542._8_8_ = 0;
  auVar542._0_8_ = dVar4;
  auVar593._8_8_ = 0;
  auVar593._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar593,auVar599,auVar12);
  dVar4 = in_RSI[8];
  auVar579._8_8_ = 0;
  auVar579._0_8_ = dVar4;
  auVar605._8_8_ = 0;
  auVar605._0_8_ = dVar4 + dVar4;
  auVar12 = vfmadd213sd_fma(auVar605,auVar611,auVar12);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar161,auVar586,auVar12);
  auVar476._8_8_ = 0;
  auVar476._0_8_ = in_RDX[3] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar476,auVar408,auVar12);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar162,auVar599,auVar12);
  auVar229._8_8_ = 0;
  auVar229._0_8_ = in_RDX[4] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar229,auVar542,auVar12);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar163,auVar611,auVar12);
  auVar230._8_8_ = 0;
  auVar230._0_8_ = in_RDX[5] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar230,auVar579,auVar12);
  *(long *)(ctx + 0x798) = auVar12._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  dVar3 = in_RSI[5];
  dVar4 = in_RSI[6];
  auVar587._8_8_ = 0;
  auVar587._0_8_ = dVar4;
  dVar5 = in_RSI[7];
  auVar580._8_8_ = 0;
  auVar580._0_8_ = dVar5;
  dVar6 = in_RSI[8];
  auVar567._8_8_ = 0;
  auVar567._0_8_ = dVar6;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       dVar6 * dVar6 +
       (dVar1 * dVar1 - auVar17._0_8_ * auVar17._0_8_) + dVar2 * dVar2 + dVar3 * dVar3 +
       dVar4 * dVar4 + dVar5 * dVar5;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar164,auVar587,auVar16);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar2 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar22,auVar580,auVar12);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar17,auVar567,auVar12);
  *(long *)(ctx + 0x810) = auVar12._0_8_;
  return (int)ctx;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::init(
    Eigen::Matrix<double,15,18> & groebnerMatrix,
    const Eigen::Matrix<double,12,1> & a,
    Eigen::Matrix<double,12,1> & n,
    Eigen::Matrix<double,12,1> & m,
    Eigen::Matrix<double,12,1> & k,
    Eigen::Vector3d & c0,
    Eigen::Vector3d & c1,
    Eigen::Vector3d & c2,
    Eigen::Vector3d & c3 )
{
  Eigen::Vector3d temp = c0-c1;
  double c01w = temp.norm()*temp.norm();
  temp = c0-c2;
  double c02w = temp.norm()*temp.norm();
  temp = c0-c3;
  double c03w = temp.norm()*temp.norm();
  temp = c1-c2;
  double c12w = temp.norm()*temp.norm();

  groebnerMatrix(0,8) = ((((((((-2*k(0,0)*k(3,0)-2*k(1,0)*k(4,0))-2*k(2,0)*k(5,0))+pow(k(0,0),2))+pow(k(3,0),2))+pow(k(1,0),2))+pow(k(4,0),2))+pow(k(2,0),2))+pow(k(5,0),2));
  groebnerMatrix(0,9) = (((((((((((2*m(0,0)*k(0,0)-2*m(0,0)*k(3,0))-2*k(0,0)*m(3,0))+2*m(3,0)*k(3,0))+2*m(1,0)*k(1,0))-2*m(1,0)*k(4,0))-2*k(1,0)*m(4,0))+2*m(4,0)*k(4,0))+2*m(2,0)*k(2,0))-2*m(2,0)*k(5,0))-2*k(2,0)*m(5,0))+2*m(5,0)*k(5,0));
  groebnerMatrix(0,10) = ((((((((-2*m(0,0)*m(3,0)-2*m(1,0)*m(4,0))-2*m(2,0)*m(5,0))+pow(m(0,0),2))+pow(m(3,0),2))+pow(m(1,0),2))+pow(m(4,0),2))+pow(m(2,0),2))+pow(m(5,0),2));
  groebnerMatrix(0,11) = (((((((((((2*n(0,0)*k(0,0)-2*n(0,0)*k(3,0))-2*k(0,0)*n(3,0))+2*n(3,0)*k(3,0))+2*n(1,0)*k(1,0))-2*n(1,0)*k(4,0))-2*k(1,0)*n(4,0))+2*n(4,0)*k(4,0))+2*n(2,0)*k(2,0))-2*n(2,0)*k(5,0))-2*k(2,0)*n(5,0))+2*n(5,0)*k(5,0));
  groebnerMatrix(0,12) = (((((((((((2*n(0,0)*m(0,0)-2*n(0,0)*m(3,0))-2*m(0,0)*n(3,0))+2*n(3,0)*m(3,0))+2*n(1,0)*m(1,0))-2*n(1,0)*m(4,0))-2*m(1,0)*n(4,0))+2*n(4,0)*m(4,0))+2*n(2,0)*m(2,0))-2*n(2,0)*m(5,0))-2*m(2,0)*n(5,0))+2*n(5,0)*m(5,0));
  groebnerMatrix(0,13) = ((((((((-2*n(0,0)*n(3,0)-2*n(1,0)*n(4,0))-2*n(2,0)*n(5,0))+pow(n(0,0),2))+pow(n(3,0),2))+pow(n(1,0),2))+pow(n(4,0),2))+pow(n(2,0),2))+pow(n(5,0),2));
  groebnerMatrix(0,14) = (((((((((((2*a(0,0)*k(0,0)-2*a(0,0)*k(3,0))-2*k(0,0)*a(3,0))+2*a(3,0)*k(3,0))+2*a(1,0)*k(1,0))-2*a(1,0)*k(4,0))-2*k(1,0)*a(4,0))+2*a(4,0)*k(4,0))+2*a(2,0)*k(2,0))-2*a(2,0)*k(5,0))-2*k(2,0)*a(5,0))+2*a(5,0)*k(5,0));
  groebnerMatrix(0,15) = (((((((((((2*a(0,0)*m(0,0)-2*a(0,0)*m(3,0))-2*m(0,0)*a(3,0))+2*a(3,0)*m(3,0))+2*a(1,0)*m(1,0))-2*a(1,0)*m(4,0))-2*m(1,0)*a(4,0))+2*a(4,0)*m(4,0))+2*a(2,0)*m(2,0))-2*a(2,0)*m(5,0))-2*m(2,0)*a(5,0))+2*a(5,0)*m(5,0));
  groebnerMatrix(0,16) = (((((((((((2*a(0,0)*n(0,0)-2*a(0,0)*n(3,0))-2*n(0,0)*a(3,0))+2*a(3,0)*n(3,0))+2*a(1,0)*n(1,0))-2*a(1,0)*n(4,0))-2*n(1,0)*a(4,0))+2*a(4,0)*n(4,0))+2*a(2,0)*n(2,0))-2*a(2,0)*n(5,0))-2*n(2,0)*a(5,0))+2*a(5,0)*n(5,0));
  groebnerMatrix(0,17) = (((((((((-c01w+pow(a(0,0),2))-2*a(0,0)*a(3,0))+pow(a(3,0),2))+pow(a(1,0),2))-2*a(1,0)*a(4,0))+pow(a(4,0),2))+pow(a(2,0),2))-2*a(2,0)*a(5,0))+pow(a(5,0),2));
  groebnerMatrix(1,8) = ((((((((-2*k(0,0)*k(6,0)-2*k(1,0)*k(7,0))-2*k(2,0)*k(8,0))+pow(k(0,0),2))+pow(k(1,0),2))+pow(k(2,0),2))+pow(k(6,0),2))+pow(k(7,0),2))+pow(k(8,0),2));
  groebnerMatrix(1,9) = (((((((((((2*m(0,0)*k(0,0)+2*m(1,0)*k(1,0))+2*m(2,0)*k(2,0))-2*m(0,0)*k(6,0))-2*k(0,0)*m(6,0))+2*m(6,0)*k(6,0))-2*m(1,0)*k(7,0))-2*k(1,0)*m(7,0))+2*m(7,0)*k(7,0))-2*m(2,0)*k(8,0))-2*k(2,0)*m(8,0))+2*m(8,0)*k(8,0));
  groebnerMatrix(1,10) = ((((((((-2*m(0,0)*m(6,0)-2*m(1,0)*m(7,0))-2*m(2,0)*m(8,0))+pow(m(0,0),2))+pow(m(1,0),2))+pow(m(2,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2));
  groebnerMatrix(1,11) = (((((((((((2*n(0,0)*k(0,0)+2*n(1,0)*k(1,0))+2*n(2,0)*k(2,0))-2*n(0,0)*k(6,0))-2*k(0,0)*n(6,0))+2*n(6,0)*k(6,0))-2*n(1,0)*k(7,0))-2*k(1,0)*n(7,0))+2*n(7,0)*k(7,0))-2*n(2,0)*k(8,0))-2*k(2,0)*n(8,0))+2*n(8,0)*k(8,0));
  groebnerMatrix(1,12) = (((((((((((2*n(0,0)*m(0,0)+2*n(1,0)*m(1,0))+2*n(2,0)*m(2,0))-2*n(0,0)*m(6,0))-2*m(0,0)*n(6,0))+2*n(6,0)*m(6,0))-2*n(1,0)*m(7,0))-2*m(1,0)*n(7,0))+2*n(7,0)*m(7,0))-2*n(2,0)*m(8,0))-2*m(2,0)*n(8,0))+2*n(8,0)*m(8,0));
  groebnerMatrix(1,13) = ((((((((-2*n(0,0)*n(6,0)-2*n(1,0)*n(7,0))-2*n(2,0)*n(8,0))+pow(n(0,0),2))+pow(n(1,0),2))+pow(n(2,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2));
  groebnerMatrix(1,14) = (((((((((((2*a(0,0)*k(0,0)+2*a(1,0)*k(1,0))+2*a(2,0)*k(2,0))-2*a(0,0)*k(6,0))-2*k(0,0)*a(6,0))+2*a(6,0)*k(6,0))-2*a(1,0)*k(7,0))-2*k(1,0)*a(7,0))+2*a(7,0)*k(7,0))-2*a(2,0)*k(8,0))-2*k(2,0)*a(8,0))+2*a(8,0)*k(8,0));
  groebnerMatrix(1,15) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))-2*a(0,0)*m(6,0))-2*m(0,0)*a(6,0))+2*a(6,0)*m(6,0))-2*a(1,0)*m(7,0))-2*m(1,0)*a(7,0))+2*a(7,0)*m(7,0))-2*a(2,0)*m(8,0))-2*m(2,0)*a(8,0))+2*a(8,0)*m(8,0));
  groebnerMatrix(1,16) = (((((((((((2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))-2*a(0,0)*n(6,0))-2*n(0,0)*a(6,0))+2*a(6,0)*n(6,0))-2*a(1,0)*n(7,0))-2*n(1,0)*a(7,0))+2*a(7,0)*n(7,0))-2*a(2,0)*n(8,0))-2*n(2,0)*a(8,0))+2*a(8,0)*n(8,0));
  groebnerMatrix(1,17) = (((((((((-c02w+pow(a(0,0),2))+pow(a(1,0),2))+pow(a(2,0),2))-2*a(0,0)*a(6,0))+pow(a(6,0),2))-2*a(1,0)*a(7,0))+pow(a(7,0),2))-2*a(2,0)*a(8,0))+pow(a(8,0),2));
  groebnerMatrix(2,8) = ((((((((pow(k(0,0),2)+pow(k(1,0),2))+pow(k(2,0),2))+pow(k(9,0),2))+pow(k(10,0),2))+pow(k(11,0),2))-2*k(0,0)*k(9,0))-2*k(1,0)*k(10,0))-2*k(2,0)*k(11,0));
  groebnerMatrix(2,9) = (((((((((((2*m(0,0)*k(0,0)+2*m(1,0)*k(1,0))+2*m(2,0)*k(2,0))-2*m(0,0)*k(9,0))-2*k(0,0)*m(9,0))+2*m(9,0)*k(9,0))-2*m(1,0)*k(10,0))-2*k(1,0)*m(10,0))+2*m(10,0)*k(10,0))-2*m(2,0)*k(11,0))-2*k(2,0)*m(11,0))+2*m(11,0)*k(11,0));
  groebnerMatrix(2,10) = ((((((((pow(m(0,0),2)+pow(m(1,0),2))+pow(m(2,0),2))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2))-2*m(0,0)*m(9,0))-2*m(1,0)*m(10,0))-2*m(2,0)*m(11,0));
  groebnerMatrix(2,11) = (((((((((((2*n(0,0)*k(0,0)+2*n(1,0)*k(1,0))+2*n(2,0)*k(2,0))-2*n(0,0)*k(9,0))-2*k(0,0)*n(9,0))+2*n(9,0)*k(9,0))-2*n(1,0)*k(10,0))-2*k(1,0)*n(10,0))+2*n(10,0)*k(10,0))-2*n(2,0)*k(11,0))-2*k(2,0)*n(11,0))+2*n(11,0)*k(11,0));
  groebnerMatrix(2,12) = (((((((((((2*n(0,0)*m(0,0)+2*n(1,0)*m(1,0))+2*n(2,0)*m(2,0))-2*n(0,0)*m(9,0))-2*m(0,0)*n(9,0))+2*n(9,0)*m(9,0))-2*n(1,0)*m(10,0))-2*m(1,0)*n(10,0))+2*n(10,0)*m(10,0))-2*n(2,0)*m(11,0))-2*m(2,0)*n(11,0))+2*n(11,0)*m(11,0));
  groebnerMatrix(2,13) = ((((((((pow(n(0,0),2)+pow(n(1,0),2))+pow(n(2,0),2))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2))-2*n(0,0)*n(9,0))-2*n(1,0)*n(10,0))-2*n(2,0)*n(11,0));
  groebnerMatrix(2,14) = (((((((((((2*a(0,0)*k(0,0)+2*a(1,0)*k(1,0))+2*a(2,0)*k(2,0))-2*a(0,0)*k(9,0))-2*k(0,0)*a(9,0))+2*a(9,0)*k(9,0))-2*a(1,0)*k(10,0))-2*k(1,0)*a(10,0))+2*a(10,0)*k(10,0))-2*a(2,0)*k(11,0))-2*k(2,0)*a(11,0))+2*a(11,0)*k(11,0));
  groebnerMatrix(2,15) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))-2*a(0,0)*m(9,0))-2*m(0,0)*a(9,0))+2*a(9,0)*m(9,0))-2*a(1,0)*m(10,0))-2*m(1,0)*a(10,0))+2*a(10,0)*m(10,0))-2*a(2,0)*m(11,0))-2*m(2,0)*a(11,0))+2*a(11,0)*m(11,0));
  groebnerMatrix(2,16) = (((((((((((2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))-2*a(0,0)*n(9,0))-2*n(0,0)*a(9,0))+2*a(9,0)*n(9,0))-2*a(1,0)*n(10,0))-2*n(1,0)*a(10,0))+2*a(10,0)*n(10,0))-2*a(2,0)*n(11,0))-2*n(2,0)*a(11,0))+2*a(11,0)*n(11,0));
  groebnerMatrix(2,17) = (((((((((-c03w+pow(a(0,0),2))+pow(a(1,0),2))+pow(a(2,0),2))-2*a(0,0)*a(9,0))+pow(a(9,0),2))-2*a(1,0)*a(10,0))+pow(a(10,0),2))-2*a(2,0)*a(11,0))+pow(a(11,0),2));
  groebnerMatrix(3,8) = ((((((((pow(k(3,0),2)+pow(k(4,0),2))+pow(k(5,0),2))+pow(k(6,0),2))+pow(k(7,0),2))+pow(k(8,0),2))-2*k(3,0)*k(6,0))-2*k(4,0)*k(7,0))-2*k(5,0)*k(8,0));
  groebnerMatrix(3,9) = (((((((((((2*m(3,0)*k(3,0)+2*m(4,0)*k(4,0))+2*m(5,0)*k(5,0))+2*m(6,0)*k(6,0))+2*m(7,0)*k(7,0))+2*m(8,0)*k(8,0))-2*m(3,0)*k(6,0))-2*k(3,0)*m(6,0))-2*m(4,0)*k(7,0))-2*k(4,0)*m(7,0))-2*m(5,0)*k(8,0))-2*k(5,0)*m(8,0));
  groebnerMatrix(3,10) = ((((((((pow(m(3,0),2)+pow(m(4,0),2))+pow(m(5,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2))-2*m(3,0)*m(6,0))-2*m(4,0)*m(7,0))-2*m(5,0)*m(8,0));
  groebnerMatrix(3,11) = (((((((((((2*n(3,0)*k(3,0)+2*n(4,0)*k(4,0))+2*n(5,0)*k(5,0))+2*n(6,0)*k(6,0))+2*n(7,0)*k(7,0))+2*n(8,0)*k(8,0))-2*n(3,0)*k(6,0))-2*k(3,0)*n(6,0))-2*n(4,0)*k(7,0))-2*k(4,0)*n(7,0))-2*n(5,0)*k(8,0))-2*k(5,0)*n(8,0));
  groebnerMatrix(3,12) = (((((((((((2*n(3,0)*m(3,0)+2*n(4,0)*m(4,0))+2*n(5,0)*m(5,0))+2*n(6,0)*m(6,0))+2*n(7,0)*m(7,0))+2*n(8,0)*m(8,0))-2*n(3,0)*m(6,0))-2*m(3,0)*n(6,0))-2*n(4,0)*m(7,0))-2*m(4,0)*n(7,0))-2*n(5,0)*m(8,0))-2*m(5,0)*n(8,0));
  groebnerMatrix(3,13) = ((((((((pow(n(3,0),2)+pow(n(4,0),2))+pow(n(5,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2))-2*n(3,0)*n(6,0))-2*n(4,0)*n(7,0))-2*n(5,0)*n(8,0));
  groebnerMatrix(3,14) = (((((((((((2*a(3,0)*k(3,0)+2*a(4,0)*k(4,0))+2*a(5,0)*k(5,0))+2*a(6,0)*k(6,0))+2*a(7,0)*k(7,0))+2*a(8,0)*k(8,0))-2*a(3,0)*k(6,0))-2*k(3,0)*a(6,0))-2*a(4,0)*k(7,0))-2*k(4,0)*a(7,0))-2*a(5,0)*k(8,0))-2*k(5,0)*a(8,0));
  groebnerMatrix(3,15) = (((((((((((2*a(3,0)*m(3,0)+2*a(4,0)*m(4,0))+2*a(5,0)*m(5,0))+2*a(6,0)*m(6,0))+2*a(7,0)*m(7,0))+2*a(8,0)*m(8,0))-2*a(3,0)*m(6,0))-2*m(3,0)*a(6,0))-2*a(4,0)*m(7,0))-2*m(4,0)*a(7,0))-2*a(5,0)*m(8,0))-2*m(5,0)*a(8,0));
  groebnerMatrix(3,16) = (((((((((((2*a(3,0)*n(3,0)+2*a(4,0)*n(4,0))+2*a(5,0)*n(5,0))+2*a(6,0)*n(6,0))+2*a(7,0)*n(7,0))+2*a(8,0)*n(8,0))-2*a(3,0)*n(6,0))-2*n(3,0)*a(6,0))-2*a(4,0)*n(7,0))-2*n(4,0)*a(7,0))-2*a(5,0)*n(8,0))-2*n(5,0)*a(8,0));
  groebnerMatrix(3,17) = (((((((((-c12w+pow(a(3,0),2))+pow(a(4,0),2))+pow(a(5,0),2))+pow(a(6,0),2))+pow(a(7,0),2))+pow(a(8,0),2))-2*a(3,0)*a(6,0))-2*a(4,0)*a(7,0))-2*a(5,0)*a(8,0));
}